

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTS_vocoder.c
# Opt level: O0

double HTS_b2en(HTS_Vocoder *v,double *b,int m,double a)

{
  void *pvVar1;
  long lVar2;
  double a_00;
  int in_EDX;
  HTS_Vocoder *in_RSI;
  long in_RDI;
  double *in_XMM0_Qa;
  double *ir;
  double *cep;
  double en;
  int i;
  size_t in_stack_ffffffffffffffc0;
  size_t in_stack_ffffffffffffffc8;
  double *h;
  undefined4 in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffdc;
  int iVar3;
  undefined4 in_stack_ffffffffffffffe8;
  
  h = (double *)0x0;
  if (*(ulong *)(in_RDI + 0x90) < (ulong)(long)in_EDX) {
    if (*(long *)(in_RDI + 0x88) != 0) {
      HTS_free((void *)0x115097);
    }
    pvVar1 = HTS_calloc(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
    *(void **)(in_RDI + 0x88) = pvVar1;
    *(long *)(in_RDI + 0x90) = (long)in_EDX;
  }
  lVar2 = *(long *)(in_RDI + 0x88) + (long)in_EDX * 8;
  a_00 = (double)(lVar2 + 8);
  lVar2 = lVar2 + 0x1208;
  HTS_b2mc((double *)in_RSI,*(double **)(in_RDI + 0x88),in_EDX,(double)in_XMM0_Qa);
  HTS_freqt(in_RSI,(double *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),
            (int)((ulong)in_XMM0_Qa >> 0x20),
            (double *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
            (int)((ulong)h >> 0x20),a_00);
  HTS_c2ir(in_XMM0_Qa,in_stack_ffffffffffffffdc,h,(int)((ulong)a_00 >> 0x20));
  for (iVar3 = 0; iVar3 < 0x240; iVar3 = iVar3 + 1) {
    h = (double *)
        (*(double *)(lVar2 + (long)iVar3 * 8) * *(double *)(lVar2 + (long)iVar3 * 8) + (double)h);
  }
  return (double)h;
}

Assistant:

static double HTS_b2en(HTS_Vocoder * v, const double *b, const int m, const double a)
{
   int i;
   double en = 0.0;
   double *cep;
   double *ir;

   if (v->spectrum2en_size < m) {
      if (v->spectrum2en_buff != NULL)
         HTS_free(v->spectrum2en_buff);
      v->spectrum2en_buff = (double *) HTS_calloc((m + 1) + 2 * IRLENG, sizeof(double));
      v->spectrum2en_size = m;
   }
   cep = v->spectrum2en_buff + m + 1;
   ir = cep + IRLENG;

   HTS_b2mc(b, v->spectrum2en_buff, m, a);
   HTS_freqt(v, v->spectrum2en_buff, m, cep, IRLENG - 1, -a);
   HTS_c2ir(cep, IRLENG, ir, IRLENG);

   for (i = 0; i < IRLENG; i++)
      en += ir[i] * ir[i];

   return (en);
}